

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndFrame(void)

{
  int *piVar1;
  uint uVar2;
  _func_void_int_int *p_Var3;
  char *__s1;
  ImGuiWindow **ppIVar4;
  unsigned_short *puVar5;
  bool bVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  ImU32 key;
  ImVec2 in_RAX;
  ImGuiWindow *pIVar10;
  ImGuiWindow **ppIVar11;
  ulong uVar12;
  unsigned_short *__dest;
  byte bVar13;
  uint uVar14;
  int iVar15;
  char *pcVar16;
  char *label;
  long lVar17;
  ImGuiContext *g;
  int iVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  ImVec2 local_38;
  
  pIVar9 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x100d,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    if (GImGui->FrameScopeActive == false) {
      __assert_fail("g.FrameScopeActive && \"Forgot to call ImGui::NewFrame()?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x1010,"void ImGui::EndFrame()");
    }
    p_Var3 = (GImGui->IO).ImeSetInputScreenPosFn;
    local_38 = in_RAX;
    if (p_Var3 != (_func_void_int_int *)0x0) {
      fVar20 = (GImGui->PlatformImeLastPos).x;
      if (((fVar20 == 3.4028235e+38) && (!NAN(fVar20))) ||
         (fVar20 = fVar20 - (GImGui->PlatformImePos).x,
         fVar21 = (GImGui->PlatformImeLastPos).y - (GImGui->PlatformImePos).y,
         0.0001 < fVar20 * fVar20 + fVar21 * fVar21)) {
        (*p_Var3)((int)(GImGui->PlatformImePos).x,(int)(GImGui->PlatformImePos).y);
        pIVar9->PlatformImeLastPos = pIVar9->PlatformImePos;
      }
    }
    iVar15 = (pIVar9->CurrentWindowStack).Size;
    if (iVar15 != 1) {
      if (iVar15 < 2) {
        __assert_fail("g.CurrentWindowStack.Size == 1 && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                      ,0x1025,"void ImGui::EndFrame()");
      }
      __assert_fail("g.CurrentWindowStack.Size == 1 && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x101f,"void ImGui::EndFrame()");
    }
    pIVar9->FrameScopePushedImplicitWindow = false;
    pIVar10 = pIVar9->CurrentWindow;
    if ((pIVar10 != (ImGuiWindow *)0x0) && (pIVar10->WriteAccessed == false)) {
      pIVar10->Active = false;
    }
    End();
    pIVar8 = GImGui;
    if (pIVar9->NavWindowingTarget != (ImGuiWindow *)0x0) {
      if (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0) {
        __assert_fail("g.NavWindowingTarget != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                      ,0x221f,"void ImGui::NavUpdateWindowingList()");
      }
      if (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15) {
        if (GImGui->NavWindowingList == (ImGuiWindow *)0x0) {
          key = ImHashStr("###NavWindowingList",0,0);
          pIVar10 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar8->WindowsById,key);
          pIVar8->NavWindowingList = pIVar10;
        }
        fVar20 = (pIVar8->IO).DisplaySize.x;
        fVar21 = (pIVar8->IO).DisplaySize.y;
        (pIVar8->NextWindowData).SizeConstraintRect.Min.x = fVar20 * 0.2;
        (pIVar8->NextWindowData).SizeConstraintRect.Min.y = fVar21 * 0.2;
        (pIVar8->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
        (pIVar8->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
        (pIVar8->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
        (pIVar8->NextWindowData).SizeCallbackUserData = (void *)0x0;
        *(byte *)&(pIVar8->NextWindowData).Flags = (byte)(pIVar8->NextWindowData).Flags | 0x11;
        IVar7.y = fVar21 * 0.5;
        IVar7.x = fVar20 * 0.5;
        (pIVar8->NextWindowData).PosVal = IVar7;
        (pIVar8->NextWindowData).PosPivotVal.x = 0.5;
        (pIVar8->NextWindowData).PosPivotVal.y = 0.5;
        (pIVar8->NextWindowData).PosCond = 1;
        fVar20 = (pIVar8->Style).WindowPadding.x;
        fVar21 = (pIVar8->Style).WindowPadding.y;
        local_38.y = fVar21 + fVar21;
        local_38.x = fVar20 + fVar20;
        PushStyleVar(1,&local_38);
        Begin("###NavWindowingList",(bool *)0x0,0xc1347);
        lVar17 = (long)(pIVar8->WindowsFocusOrder).Size;
        if (0 < lVar17) {
          do {
            if ((pIVar8->WindowsFocusOrder).Size < lVar17) goto LAB_00144466;
            pIVar10 = (pIVar8->WindowsFocusOrder).Data[lVar17 + -1];
            if (((pIVar10->Active == true) && (pIVar10->RootWindow == pIVar10)) &&
               (uVar14 = pIVar10->Flags, (uVar14 >> 0x13 & 1) == 0)) {
              __s1 = pIVar10->Name;
              pcVar16 = __s1;
              if (__s1 != (char *)0xffffffffffffffff) {
                do {
                  if (*pcVar16 == '#') {
                    if (pcVar16[1] == '#') goto LAB_00144061;
                  }
                  else if (*pcVar16 == '\0') goto LAB_00144061;
                  pcVar16 = pcVar16 + 1;
                } while (pcVar16 != (char *)0xffffffffffffffff);
                pcVar16 = (char *)0xffffffffffffffff;
              }
LAB_00144061:
              label = __s1;
              if ((__s1 == pcVar16) && (label = "(Popup)", (uVar14 >> 0x1a & 1) == 0)) {
                if ((uVar14 >> 10 & 1) != 0) {
                  iVar15 = strcmp(__s1,"##MainMenuBar");
                  label = "(Main menu bar)";
                  if (iVar15 == 0) goto LAB_0014409c;
                }
                label = "(Untitled)";
              }
LAB_0014409c:
              local_38.x = 0.0;
              local_38.y = 0.0;
              Selectable(label,pIVar8->NavWindowingTarget == pIVar10,0,&local_38);
            }
            bVar6 = 1 < lVar17;
            lVar17 = lVar17 + -1;
          } while (bVar6);
        }
        End();
        PopStyleVar(1);
      }
    }
    if (pIVar9->DragDropActive == true) {
      if ((pIVar9->DragDropPayload).DataFrameCount + 1 < pIVar9->FrameCount) {
        bVar13 = 1;
        if ((pIVar9->DragDropSourceFlags & 0x20) == 0) {
          if (4 < (ulong)(uint)pIVar9->DragDropMouseButton) {
            __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown)/sizeof(*g.IO.MouseDown)))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                          ,0x1126,"bool ImGui::IsMouseDown(int)");
          }
          bVar13 = (GImGui->IO).MouseDown[(uint)pIVar9->DragDropMouseButton] ^ 1;
        }
      }
      else {
        bVar13 = 0;
      }
      if ((bVar13 != 0) || ((pIVar9->DragDropPayload).Delivery != false)) {
        ClearDragDrop();
      }
    }
    if ((pIVar9->DragDropActive == true) && (pIVar9->DragDropSourceFrameCount < pIVar9->FrameCount))
    {
      pIVar9->DragDropWithinSourceOrTarget = true;
      SetTooltip("...");
      pIVar9->DragDropWithinSourceOrTarget = false;
    }
    pIVar9->FrameScopeActive = false;
    pIVar9->FrameCountEnded = pIVar9->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    iVar15 = (pIVar9->WindowsSortBuffer).Capacity;
    if (iVar15 < 0) {
      uVar14 = iVar15 / 2 + iVar15;
      uVar12 = 0;
      if (0 < (int)uVar14) {
        uVar12 = (ulong)uVar14;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar11 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar12 * 8,GImAllocatorUserData);
      ppIVar4 = (pIVar9->WindowsSortBuffer).Data;
      if (ppIVar4 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar11,ppIVar4,(long)(pIVar9->WindowsSortBuffer).Size << 3);
        ppIVar4 = (pIVar9->WindowsSortBuffer).Data;
        if ((ppIVar4 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      (pIVar9->WindowsSortBuffer).Data = ppIVar11;
      (pIVar9->WindowsSortBuffer).Capacity = (int)uVar12;
    }
    (pIVar9->WindowsSortBuffer).Size = 0;
    iVar15 = (pIVar9->Windows).Size;
    if ((pIVar9->WindowsSortBuffer).Capacity < iVar15) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar11 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar15 << 3,GImAllocatorUserData);
      ppIVar4 = (pIVar9->WindowsSortBuffer).Data;
      if (ppIVar4 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar11,ppIVar4,(long)(pIVar9->WindowsSortBuffer).Size << 3);
        ppIVar4 = (pIVar9->WindowsSortBuffer).Data;
        if ((ppIVar4 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      (pIVar9->WindowsSortBuffer).Data = ppIVar11;
      (pIVar9->WindowsSortBuffer).Capacity = iVar15;
    }
    uVar14 = (pIVar9->Windows).Size;
    uVar12 = (ulong)uVar14;
    if (uVar14 != 0) {
      uVar19 = 0;
      do {
        if ((long)(int)uVar12 <= (long)uVar19) {
LAB_00144466:
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                        ,0x4d8,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
        }
        pIVar10 = (pIVar9->Windows).Data[uVar19];
        if ((pIVar10->Active != true) || ((pIVar10->Flags & 0x1000000) == 0)) {
          AddWindowToSortBuffer(&pIVar9->WindowsSortBuffer,pIVar10);
        }
        uVar19 = uVar19 + 1;
        uVar14 = (pIVar9->Windows).Size;
        uVar12 = (ulong)uVar14;
      } while (uVar19 != uVar12);
    }
    uVar2 = (pIVar9->WindowsSortBuffer).Size;
    if (uVar14 != uVar2) {
      __assert_fail("g.Windows.Size == g.WindowsSortBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x1058,"void ImGui::EndFrame()");
    }
    (pIVar9->WindowsSortBuffer).Size = uVar14;
    (pIVar9->Windows).Size = uVar2;
    iVar15 = (pIVar9->WindowsSortBuffer).Capacity;
    (pIVar9->WindowsSortBuffer).Capacity = (pIVar9->Windows).Capacity;
    (pIVar9->Windows).Capacity = iVar15;
    ppIVar4 = (pIVar9->WindowsSortBuffer).Data;
    (pIVar9->WindowsSortBuffer).Data = (pIVar9->Windows).Data;
    (pIVar9->Windows).Data = ppIVar4;
    (pIVar9->IO).MetricsActiveWindows = pIVar9->WindowsActiveCount;
    ((pIVar9->IO).Fonts)->Locked = false;
    (pIVar9->IO).MouseWheel = 0.0;
    (pIVar9->IO).MouseWheelH = 0.0;
    iVar15 = (pIVar9->IO).InputQueueCharacters.Capacity;
    if (iVar15 < 0) {
      iVar15 = iVar15 / 2 + iVar15;
      iVar18 = 0;
      if (0 < iVar15) {
        iVar18 = iVar15;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (unsigned_short *)
               (*GImAllocatorAllocFunc)((ulong)(uint)(iVar18 * 2),GImAllocatorUserData);
      puVar5 = (pIVar9->IO).InputQueueCharacters.Data;
      if (puVar5 != (unsigned_short *)0x0) {
        memcpy(__dest,puVar5,(long)(pIVar9->IO).InputQueueCharacters.Size * 2);
        puVar5 = (pIVar9->IO).InputQueueCharacters.Data;
        if ((puVar5 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar5,GImAllocatorUserData);
      }
      (pIVar9->IO).InputQueueCharacters.Data = __dest;
      (pIVar9->IO).InputQueueCharacters.Capacity = iVar18;
    }
    (pIVar9->IO).InputQueueCharacters.Size = 0;
    (pIVar9->IO).NavInputs[0] = 0.0;
    (pIVar9->IO).NavInputs[1] = 0.0;
    (pIVar9->IO).NavInputs[2] = 0.0;
    (pIVar9->IO).NavInputs[3] = 0.0;
    (pIVar9->IO).NavInputs[4] = 0.0;
    (pIVar9->IO).NavInputs[5] = 0.0;
    (pIVar9->IO).NavInputs[6] = 0.0;
    (pIVar9->IO).NavInputs[7] = 0.0;
    (pIVar9->IO).NavInputs[8] = 0.0;
    (pIVar9->IO).NavInputs[9] = 0.0;
    (pIVar9->IO).NavInputs[10] = 0.0;
    (pIVar9->IO).NavInputs[0xb] = 0.0;
    (pIVar9->IO).NavInputs[0xc] = 0.0;
    (pIVar9->IO).NavInputs[0xd] = 0.0;
    (pIVar9->IO).NavInputs[0xe] = 0.0;
    (pIVar9->IO).NavInputs[0xf] = 0.0;
    (pIVar9->IO).NavInputs[0x10] = 0.0;
    (pIVar9->IO).NavInputs[0x11] = 0.0;
    (pIVar9->IO).NavInputs[0x12] = 0.0;
    (pIVar9->IO).NavInputs[0x13] = 0.0;
    (pIVar9->IO).NavInputs[0x14] = 0.0;
    (pIVar9->IO).NavInputs[0x15] = 0.0;
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;
    IM_ASSERT(g.FrameScopeActive && "Forgot to call ImGui::NewFrame()?");

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Report when there is a mismatch of Begin/BeginChild vs End/EndChild calls. Important: Remember that the Begin/BeginChild API requires you
    // to always call End/EndChild even if Begin/BeginChild returns false! (this is unfortunately inconsistent with most other Begin* API).
    if (g.CurrentWindowStack.Size != 1)
    {
        if (g.CurrentWindowStack.Size > 1)
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?");
            while (g.CurrentWindowStack.Size > 1) // FIXME-ERRORHANDLING
                End();
        }
        else
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?");
        }
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.FrameScopePushedImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget)
        NavUpdateWindowingList();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount)
    {
        g.DragDropWithinSourceOrTarget = true;
        SetTooltip("...");
        g.DragDropWithinSourceOrTarget = false;
    }

    // End frame
    g.FrameScopeActive = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);
    g.Windows.swap(g.WindowsSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}